

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bootstrap_analysis *
Catch::Benchmark::Detail::analyse_samples
          (bootstrap_analysis *__return_storage_ptr__,double confidence_level,uint n_resamples,
          double *first,double *last)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double k;
  double dVar13;
  Estimate<double> stddev_estimate;
  Estimate<double> mean_estimate;
  anon_class_32_4_6f2d8bc5 Estimate;
  Estimate<double> local_90;
  Estimate<double> local_70;
  anon_class_32_4_6f2d8bc5 local_50;
  
  local_50.n_resamples = n_resamples;
  local_50.first = first;
  local_50.last = last;
  local_50.confidence_level = confidence_level;
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()(&local_70,&local_50,mean);
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            (&local_90,&local_50,anon_unknown_7::standard_deviation);
  dVar7 = local_90.point;
  iVar3 = (int)((ulong)((long)last - (long)first) >> 3);
  dVar8 = (double)iVar3;
  dVar13 = local_70.point / dVar8;
  dVar9 = dVar13 * 0.5 * 0.25;
  if (dVar8 < 0.0) {
    dVar4 = sqrt(dVar8);
  }
  else {
    dVar4 = SQRT(dVar8);
  }
  dVar1 = dVar7 / dVar4;
  if (dVar9 <= dVar7 / dVar4) {
    dVar1 = dVar9;
  }
  dVar1 = dVar1 * dVar1;
  dVar7 = dVar7 * dVar7;
  dVar10 = (double)-iVar3;
  dVar12 = dVar7 - dVar8 * dVar1;
  dVar9 = dVar13 - dVar13 * 0.5;
  dVar4 = dVar9 * dVar9 * dVar8;
  dVar9 = dVar13 * dVar13 * dVar8;
  dVar13 = dVar10 * dVar4;
  dVar10 = dVar10 * dVar9;
  dVar4 = dVar12 + dVar4;
  dVar12 = dVar12 + dVar9;
  dVar9 = dVar12 * dVar12 + dVar10 * dVar1 * -4.0;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  auVar11._0_8_ = dVar13 * -2.0;
  auVar11._8_8_ = dVar10 * -2.0;
  dVar13 = dVar4 * dVar4 + dVar1 * -4.0 * dVar13;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  auVar5._0_8_ = dVar13 + dVar4;
  auVar5._8_8_ = dVar9 + dVar12;
  auVar11 = divpd(auVar11,auVar5);
  dVar9 = (double)(int)auVar11._0_8_;
  if ((double)(int)auVar11._8_8_ <= (double)(int)auVar11._0_8_) {
    dVar9 = (double)(int)auVar11._8_8_;
  }
  auVar6._8_8_ = dVar8 + -1.0;
  auVar6._0_8_ = dVar8 - dVar9;
  auVar2._8_8_ = dVar8;
  auVar2._0_8_ = dVar8;
  auVar11 = divpd(auVar6,auVar2);
  dVar9 = (dVar7 - dVar1 * (dVar8 - dVar9)) * auVar11._0_8_;
  dVar8 = (dVar7 - dVar1 * (dVar8 + -1.0)) * auVar11._8_8_;
  if (dVar8 <= dVar9) {
    dVar9 = dVar8;
  }
  (__return_storage_ptr__->mean).upper_bound = local_70.upper_bound;
  (__return_storage_ptr__->mean).confidence_interval = local_70.confidence_interval;
  (__return_storage_ptr__->mean).point = local_70.point;
  (__return_storage_ptr__->mean).lower_bound = local_70.lower_bound;
  (__return_storage_ptr__->standard_deviation).point = local_90.point;
  (__return_storage_ptr__->standard_deviation).lower_bound = local_90.lower_bound;
  (__return_storage_ptr__->standard_deviation).upper_bound = local_90.upper_bound;
  (__return_storage_ptr__->standard_deviation).confidence_interval = local_90.confidence_interval;
  __return_storage_ptr__->outlier_variance = dVar9 / dVar7;
  return __return_storage_ptr__;
}

Assistant:

bootstrap_analysis analyse_samples(double confidence_level,
                                               unsigned int n_resamples,
                                               double* first,
                                               double* last) {
                auto mean = &Detail::mean;
                auto stddev = &standard_deviation;

#if defined(CATCH_CONFIG_USE_ASYNC)
                auto Estimate = [=](double(*f)(double const*, double const*)) {
                    std::random_device rd;
                    auto seed = rd();
                    return std::async(std::launch::async, [=] {
                        SimplePcg32 rng( seed );
                        auto resampled = resample(rng, n_resamples, first, last, f);
                        return bootstrap(confidence_level, first, last, resampled, f);
                    });
                };

                auto mean_future = Estimate(mean);
                auto stddev_future = Estimate(stddev);

                auto mean_estimate = mean_future.get();
                auto stddev_estimate = stddev_future.get();
#else
                auto Estimate = [=](double(*f)(double const* , double const*)) {
                    std::random_device rd;
                    auto seed = rd();
                    SimplePcg32 rng( seed );
                    auto resampled = resample(rng, n_resamples, first, last, f);
                    return bootstrap(confidence_level, first, last, resampled, f);
                };

                auto mean_estimate = Estimate(mean);
                auto stddev_estimate = Estimate(stddev);
#endif // CATCH_USE_ASYNC

                auto n = static_cast<int>(last - first); // seriously, one can't use integral types without hell in C++
                double outlier_variance = Detail::outlier_variance(mean_estimate, stddev_estimate, n);

                return { mean_estimate, stddev_estimate, outlier_variance };
            }